

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O3

void __thiscall vec<vec<Clause_*>_>::push(vec<vec<Clause_*>_> *this)

{
  vec<Clause_*> *pvVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = this->sz;
  if (uVar2 == this->cap) {
    uVar3 = 2;
    if (1 < uVar2) {
      uVar3 = (ulong)(uVar2 * 3 + 1 >> 1);
    }
    this->cap = (uint)uVar3;
    pvVar1 = (vec<Clause_*> *)realloc(this->data,uVar3 << 4);
    this->data = pvVar1;
    uVar2 = this->sz;
  }
  else {
    pvVar1 = this->data;
  }
  this->sz = uVar2 + 1;
  pvVar1 = pvVar1 + uVar2;
  pvVar1->sz = 0;
  pvVar1->cap = 0;
  pvVar1->data = (Clause **)0x0;
  return;
}

Assistant:

void push() {
		if (sz == cap) {
			cap = cap <= 1 ? 2 : (cap * 3 + 1) >> 1;
			data = (T*)realloc((char*)data, cap * sizeof(T));
		}
		new (&data[sz++]) T();
	}